

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::resetPool
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtDispatcher *param_1)

{
  Handle *pHVar1;
  undefined2 *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this->m_numHandles != 0) {
    return;
  }
  this->m_firstFreeHandle = 1;
  uVar3 = (ulong)this->m_maxHandles;
  pHVar1 = this->m_pHandles;
  if (1 < uVar3) {
    puVar2 = (undefined2 *)&pHVar1[1].super_cbtBroadphaseProxy.field_0x34;
    uVar4 = 1;
    do {
      uVar4 = uVar4 + 1;
      *puVar2 = (short)uVar4;
      puVar2 = puVar2 + 0x24;
      uVar3 = (ulong)this->m_maxHandles;
    } while (uVar4 < uVar3);
  }
  *(undefined2 *)&pHVar1[uVar3 - 1].super_cbtBroadphaseProxy.field_0x34 = 0;
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::resetPool(cbtDispatcher* /*dispatcher*/)
{
	if (m_numHandles == 0)
	{
		m_firstFreeHandle = 1;
		{
			for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < m_maxHandles; i++)
				m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
			m_pHandles[m_maxHandles - 1].SetNextFree(0);
		}
	}
}